

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O1

void SimpleBVH::point_segment_squared_distance
               (VectorMax3d *point,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *f,
               VectorMax3d *closest_point,double *dist)

{
  plainobjectbase_evaluator_data<double,_0> pVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  Index size;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  SrcEvaluatorType srcEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  ActualDstType actualDst;
  Scalar SVar11;
  double dVar12;
  double dVar13;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_80;
  Scalar local_40;
  scalar_sum_op<double,_double> local_31;
  
  if (f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
      == f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
         m_rows) {
    pVar1.data = (double *)(f->_M_elems + 1);
    lVar10 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
             m_rows;
    local_80.m_lhs.m_lhs = f->_M_elems;
    local_80.m_lhs.m_rhs = (RhsNested)pVar1.data;
    if (lVar10 != 0) {
      if (0 < lVar10) {
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)pVar1.data;
        SVar11 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                             *)&local_b8,&local_31,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                             *)&local_80);
        goto LAB_00115e15;
      }
LAB_0011615f:
      pcVar7 = 
      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
      ;
LAB_001161a5:
      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                    "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Redux.h"
                    ,0x19b,pcVar7);
    }
    SVar11 = 0.0;
LAB_00115e15:
    lVar10 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
             m_rows;
    if (((point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
         lVar10) &&
       (f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
        m_rows == lVar10)) {
      lVar10 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_rows;
      dVar12 = 0.0;
      local_80.m_lhs.m_lhs = point;
      local_80.m_lhs.m_rhs = f->_M_elems;
      local_80.m_rhs.m_lhs = (LhsNested)pVar1.data;
      local_80.m_rhs.m_rhs = f->_M_elems;
      if (lVar10 != 0) {
        local_40 = SVar11;
        if (lVar10 < 1) {
          pcVar7 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
          ;
          goto LAB_001161a5;
        }
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)point;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)pVar1.data;
        local_b8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)f;
        dVar12 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                           (&local_b8,&local_31,&local_80);
        SVar11 = local_40;
      }
      if (((SVar11 == 0.0) && (!NAN(SVar11))) || (dVar12 <= 0.0)) {
        uVar8 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows;
        if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows != uVar8) {
          if (3 < uVar8) {
LAB_001161ce:
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                          ,0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                         );
          }
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_rows = uVar8;
        }
        uVar9 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                m_storage.m_rows;
        if (uVar9 != uVar8) {
LAB_00116176:
          pcVar7 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, T1 = double, T2 = double]"
          ;
LAB_0011621c:
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,pcVar7);
        }
        uVar8 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
        if ((long)uVar9 <= (long)uVar8) {
          uVar8 = uVar9;
        }
        lVar10 = uVar9 - uVar8;
        if (0 < (long)uVar8) {
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0] =
               f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
        }
        uVar6 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        if (1 < lVar10) {
          do {
            pdVar2 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + uVar8;
            dVar12 = pdVar2[1];
            pdVar3 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + uVar8;
            *pdVar3 = *pdVar2;
            pdVar3[1] = dVar12;
            uVar8 = uVar8 + 2;
          } while ((long)uVar8 < (long)uVar6);
        }
        if ((long)uVar6 < (long)uVar9) {
          do {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[uVar6] =
                 f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
      }
      else if (dVar12 <= SVar11) {
        uVar8 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows;
        if (((long)uVar8 < 0) ||
           (uVar9 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                    m_storage.m_rows, (long)uVar9 < 0)) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                       );
        }
        if (uVar8 != uVar9) {
          pcVar7 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>]"
          ;
          goto LAB_00116155;
        }
        if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows != uVar9) {
          if (3 < uVar9) goto LAB_001161ce;
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_rows = uVar9;
        }
        uVar8 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                m_storage.m_rows;
        if (uVar8 != uVar9) {
          pcVar7 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1, 0, 3, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_0011621c;
        }
        dVar12 = dVar12 / SVar11;
        uVar9 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
        if ((long)uVar8 <= (long)uVar9) {
          uVar9 = uVar8;
        }
        dVar13 = 1.0 - dVar12;
        lVar10 = uVar8 - uVar9;
        if (0 < (long)uVar9) {
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0] =
               f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0] * dVar12 +
               f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0] * dVar13;
        }
        uVar6 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar9;
        if (1 < lVar10) {
          do {
            pdVar3 = f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + uVar9;
            dVar4 = pdVar3[1];
            dVar5 = (pVar1.data + uVar9)[1];
            pdVar2 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + uVar9;
            *pdVar2 = pVar1.data[uVar9] * dVar12 + *pdVar3 * dVar13;
            pdVar2[1] = dVar5 * dVar12 + dVar4 * dVar13;
            uVar9 = uVar9 + 2;
          } while ((long)uVar9 < (long)uVar6);
        }
        if ((long)uVar6 < (long)uVar8) {
          do {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[uVar6] =
                 pVar1.data[uVar6] * dVar12 +
                 f->_M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[uVar6] * dVar13;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
      }
      else {
        uVar8 = f->_M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_rows;
        if ((closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_rows != uVar8) {
          if (3 < uVar8) goto LAB_001161ce;
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_rows = uVar8;
        }
        uVar9 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                m_storage.m_rows;
        if (uVar9 != uVar8) goto LAB_00116176;
        uVar8 = (ulong)((uint)((ulong)closest_point >> 3) & 1);
        if ((long)uVar9 <= (long)uVar8) {
          uVar8 = uVar9;
        }
        lVar10 = uVar9 - uVar8;
        if (0 < (long)uVar8) {
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0] = *pVar1.data;
        }
        uVar6 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        if (1 < lVar10) {
          do {
            dVar12 = (pVar1.data + uVar8)[1];
            pdVar2 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                     m_storage.m_data.array + uVar8;
            *pdVar2 = pVar1.data[uVar8];
            pdVar2[1] = dVar12;
            uVar8 = uVar8 + 2;
          } while ((long)uVar8 < (long)uVar6);
        }
        if ((long)uVar6 < (long)uVar9) {
          do {
            (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage
            .m_data.array[uVar6] = pVar1.data[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
        }
      }
      if ((point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows ==
          (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
          m_rows) {
        lVar10 = (closest_point->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).
                 m_storage.m_rows;
        if (lVar10 == 0) {
          dVar12 = 0.0;
LAB_0011612a:
          *dist = dVar12;
          return;
        }
        local_80.m_lhs.m_lhs = point;
        local_80.m_lhs.m_rhs = closest_point;
        if (0 < lVar10) {
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)point;
          local_b8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>)closest_point;
          dVar12 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                               *)&local_b8,&local_31,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)&local_80);
          goto LAB_0011612a;
        }
        goto LAB_0011615f;
      }
    }
  }
  pcVar7 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>, const Eigen::Matrix<double, -1, 1, 0, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, Rhs = const Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
  ;
LAB_00116155:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,pcVar7);
}

Assistant:

void point_segment_squared_distance(
    const VectorMax3d& point,
    const std::array<VectorMax3d, 2>& f,
    VectorMax3d& closest_point,
    double& dist)
{
    const double l2 = (f[0] - f[1]).squaredNorm();
    const double t = (point - f[0]).dot(f[1] - f[0]);
    if (t <= 0.0 || l2 == 0.0) {
        closest_point = f[0];
    } else if (t > l2) {
        closest_point = f[1];
    } else {
        const double lambda1 = t / l2;
        const double lambda0 = 1.0 - lambda1;
        closest_point = lambda0 * f[0] + lambda1 * f[1];
    }
    dist = (point - closest_point).squaredNorm();
}